

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase847::run(TestCase847 *this)

{
  PromiseFulfiller<void> *pPVar1;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  SourceLocation location_02;
  SourceLocation location_03;
  undefined8 node;
  size_t sVar2;
  Promise<void> *pPVar3;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *pOVar4;
  bool bVar5;
  undefined7 extraout_var;
  ulong uVar6;
  char *pcVar7;
  uint *tasksCompleted_00;
  DebugExpression<bool> _kjCondition_9;
  uint tasksCompleted;
  Promise<void> promise;
  WaitScope waitScope;
  Pafs pafs;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  DebugExpression<bool> _kjCondition_1;
  EventLoop loop;
  uint local_634;
  undefined1 local_630 [16];
  undefined4 local_620;
  long local_618;
  undefined8 uStack_610;
  String local_608;
  Pafs local_5e8;
  char *local_5b0;
  char *pcStack_5a8;
  undefined8 local_5a0;
  char *local_598;
  char *pcStack_590;
  undefined8 local_588;
  undefined1 local_580 [12];
  uint uStack_574;
  ArrayDisposer *local_570;
  char *pcStack_568;
  bool local_560;
  undefined7 uStack_55f;
  DebugExpression<bool> local_3d8 [408];
  EventLoop local_240 [4];
  
  EventLoop::EventLoop(local_240);
  local_620 = 0xffffffff;
  local_618 = 0;
  uStack_610 = 0;
  local_630._8_8_ = local_240;
  EventLoop::enterScope(local_240);
  local_634 = 0;
  makeCompletionCountingPafs(&local_5e8,(uint)&local_634,tasksCompleted_00);
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_5a8 = "run";
  local_5a0 = 0x1b00000356;
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location.lineNumber = 0x356;
  location.columnNumber = 0x1b;
  joinPromises((Array<kj::Promise<void>_> *)local_630,location);
  stack0xfffffffffffffa88 = (char *)((ulong)uStack_574 << 0x20);
  local_570 = (ArrayDisposer *)0x4a8289;
  pcStack_568 = &DAT_00000005;
  local_560 = local_634 == 0;
  local_580._0_8_ = &local_634;
  if ((local_634 != 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x35a,ERROR,"\"failed: expected \" \"tasksCompleted == 0\", _kjCondition",
               (char (*) [37])"failed: expected tasksCompleted == 0",
               (DebugComparison<unsigned_int_&,_int> *)local_580);
  }
  (*((local_5e8.fulfillers.ptr)->ptr->super_PromiseRejector)._vptr_PromiseRejector[2])
            ((local_5e8.fulfillers.ptr)->ptr,local_580);
  local_580._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  stack0xfffffffffffffa88 = "run";
  local_570 = (ArrayDisposer *)0x270000035e;
  location_00.function = "run";
  location_00.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_00.lineNumber = 0x35e;
  location_00.columnNumber = 0x27;
  bVar5 = kj::_::pollImpl((PromiseNode *)local_630._0_8_,(WaitScope *)(local_630 + 8),location_00);
  local_3d8[0].value = !bVar5;
  if (bVar5 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x35e,ERROR,"\"failed: expected \" \"!promise.poll(waitScope)\", _kjCondition",
               (char (*) [42])"failed: expected !promise.poll(waitScope)",local_3d8);
  }
  stack0xfffffffffffffa88 = (char *)((ulong)stack0xfffffffffffffa88 & 0xffffffff00000000);
  local_570 = (ArrayDisposer *)0x4a8289;
  pcStack_568 = &DAT_00000005;
  local_560 = local_634 == 0;
  local_580._0_8_ = &local_634;
  if ((local_634 != 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x35f,ERROR,"\"failed: expected \" \"tasksCompleted == 0\", _kjCondition",
               (char (*) [37])"failed: expected tasksCompleted == 0",
               (DebugComparison<unsigned_int_&,_int> *)local_580);
  }
  (*((local_5e8.fulfillers.ptr[1].ptr)->super_PromiseRejector)._vptr_PromiseRejector[2])
            (local_5e8.fulfillers.ptr[1].ptr,local_580);
  local_580._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  stack0xfffffffffffffa88 = "run";
  local_570 = (ArrayDisposer *)0x2700000362;
  location_01.function = "run";
  location_01.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_01.lineNumber = 0x362;
  location_01.columnNumber = 0x27;
  bVar5 = kj::_::pollImpl((PromiseNode *)local_630._0_8_,(WaitScope *)(local_630 + 8),location_01);
  uVar6 = CONCAT71(extraout_var,bVar5) & 0xffffffff;
  local_3d8[0].value = (bool)((byte)uVar6 ^ 1);
  pcVar7 = (char *)CONCAT71((int7)(uVar6 >> 8),kj::_::Debug::minSeverity < 3);
  if (bVar5 && kj::_::Debug::minSeverity < 3) {
    pcVar7 = "\"failed: expected \" \"!promise.poll(waitScope)\", _kjCondition";
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x362,ERROR,"\"failed: expected \" \"!promise.poll(waitScope)\", _kjCondition",
               (char (*) [42])"failed: expected !promise.poll(waitScope)",local_3d8);
  }
  stack0xfffffffffffffa88 = (char *)((ulong)stack0xfffffffffffffa88 & 0xffffffff00000000);
  local_570 = (ArrayDisposer *)0x4a8289;
  pcStack_568 = &DAT_00000005;
  local_560 = local_634 == 0;
  local_580._0_8_ = &local_634;
  if ((local_634 != 0) && (kj::_::Debug::minSeverity < 3)) {
    pcVar7 = "\"failed: expected \" \"tasksCompleted == 0\", _kjCondition";
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x363,ERROR,"\"failed: expected \" \"tasksCompleted == 0\", _kjCondition",
               (char (*) [37])"failed: expected tasksCompleted == 0",
               (DebugComparison<unsigned_int_&,_int> *)local_580);
  }
  pPVar1 = local_5e8.fulfillers.ptr[2].ptr;
  kj::_::Debug::makeDescription<char_const(&)[15]>
            (&local_608,(Debug *)"\"Test exception\"","Test exception",(char (*) [15])pcVar7);
  Exception::Exception
            ((Exception *)local_580,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,0x366,&local_608);
  (**(pPVar1->super_PromiseRejector)._vptr_PromiseRejector)(pPVar1,(Exception *)local_580);
  Exception::~Exception((Exception *)local_580);
  sVar2 = local_608.content.size_;
  pcVar7 = local_608.content.ptr;
  if (local_608.content.ptr != (char *)0x0) {
    local_608.content.ptr = (char *)0x0;
    local_608.content.size_ = 0;
    (**(local_608.content.disposer)->_vptr_ArrayDisposer)
              (local_608.content.disposer,pcVar7,1,sVar2,sVar2,0);
  }
  local_580._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  stack0xfffffffffffffa88 = "run";
  local_570 = (ArrayDisposer *)0x2700000367;
  location_02.function = "run";
  location_02.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_02.lineNumber = 0x367;
  location_02.columnNumber = 0x27;
  bVar5 = kj::_::pollImpl((PromiseNode *)local_630._0_8_,(WaitScope *)(local_630 + 8),location_02);
  local_3d8[0].value = !bVar5;
  if (bVar5 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x367,ERROR,"\"failed: expected \" \"!promise.poll(waitScope)\", _kjCondition",
               (char (*) [42])"failed: expected !promise.poll(waitScope)",local_3d8);
  }
  stack0xfffffffffffffa88 = (char *)((ulong)stack0xfffffffffffffa88 & 0xffffffff00000000);
  local_570 = (ArrayDisposer *)0x4a8289;
  pcStack_568 = &DAT_00000005;
  local_560 = local_634 == 0;
  local_580._0_8_ = &local_634;
  if ((local_634 != 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x368,ERROR,"\"failed: expected \" \"tasksCompleted == 0\", _kjCondition",
               (char (*) [37])"failed: expected tasksCompleted == 0",
               (DebugComparison<unsigned_int_&,_int> *)local_580);
  }
  (*((local_5e8.fulfillers.ptr[3].ptr)->super_PromiseRejector)._vptr_PromiseRejector[2])
            (local_5e8.fulfillers.ptr[3].ptr,local_580);
  local_580._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  stack0xfffffffffffffa88 = "run";
  local_570 = (ArrayDisposer *)0x270000036b;
  location_03.function = "run";
  location_03.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_03.lineNumber = 0x36b;
  location_03.columnNumber = 0x27;
  bVar5 = kj::_::pollImpl((PromiseNode *)local_630._0_8_,(WaitScope *)(local_630 + 8),location_03);
  local_3d8[0].value = !bVar5;
  if (bVar5 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x36b,ERROR,"\"failed: expected \" \"!promise.poll(waitScope)\", _kjCondition",
               (char (*) [42])"failed: expected !promise.poll(waitScope)",local_3d8);
  }
  stack0xfffffffffffffa88 = (char *)((ulong)stack0xfffffffffffffa88 & 0xffffffff00000000);
  local_570 = (ArrayDisposer *)0x4a8289;
  pcStack_568 = &DAT_00000005;
  local_560 = local_634 == 0;
  local_580._0_8_ = &local_634;
  if ((local_634 != 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x36c,ERROR,"\"failed: expected \" \"tasksCompleted == 0\", _kjCondition",
               (char (*) [37])"failed: expected tasksCompleted == 0",
               (DebugComparison<unsigned_int_&,_int> *)local_580);
  }
  (*((local_5e8.fulfillers.ptr[4].ptr)->super_PromiseRejector)._vptr_PromiseRejector[2])
            (local_5e8.fulfillers.ptr[4].ptr,local_580);
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_590 = "operator()";
  local_588 = 0x5200000370;
  Promise<void>::wait((Promise<void> *)local_630,local_630 + 8);
  local_580._0_8_ = local_580._0_8_ & 0xffffffffffffff00;
  local_3d8[0].value = false;
  if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x370,ERROR,"\"code did not throw: \" \"promise.wait(waitScope)\"",
               (char (*) [44])"code did not throw: promise.wait(waitScope)");
  }
  if (local_580[0] == '\x01') {
    Exception::~Exception((Exception *)(local_580 + 8));
  }
  stack0xfffffffffffffa88 = (char *)CONCAT44(uStack_574,4);
  local_570 = (ArrayDisposer *)0x4a8289;
  pcStack_568 = &DAT_00000005;
  local_560 = local_634 == 4;
  local_580._0_8_ = &local_634;
  if ((local_634 != 4) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x371,ERROR,"\"failed: expected \" \"tasksCompleted == 4\", _kjCondition",
               (char (*) [37])"failed: expected tasksCompleted == 4",
               (DebugComparison<unsigned_int_&,_int> *)local_580);
  }
  node = local_630._0_8_;
  if ((PromiseArenaMember *)local_630._0_8_ != (PromiseArenaMember *)0x0) {
    local_630._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  sVar2 = local_5e8.fulfillers.size_;
  pOVar4 = local_5e8.fulfillers.ptr;
  if (local_5e8.fulfillers.ptr != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0) {
    local_5e8.fulfillers.ptr = (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0;
    local_5e8.fulfillers.size_ = 0;
    (**(local_5e8.fulfillers.disposer)->_vptr_ArrayDisposer)
              (local_5e8.fulfillers.disposer,pOVar4,0x10,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::
               destruct);
  }
  sVar2 = local_5e8.promises.size_;
  pPVar3 = local_5e8.promises.ptr;
  if (local_5e8.promises.ptr != (Promise<void> *)0x0) {
    local_5e8.promises.ptr = (Promise<void> *)0x0;
    local_5e8.promises.size_ = 0;
    (**(local_5e8.promises.disposer)->_vptr_ArrayDisposer)
              (local_5e8.promises.disposer,pPVar3,8,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::Promise<void>_>::destruct);
  }
  if (local_618 == 0) {
    EventLoop::leaveScope((EventLoop *)local_630._8_8_);
  }
  EventLoop::~EventLoop(local_240);
  return;
}

Assistant:

TEST(Async, ArrayJoinException) {
  EventLoop loop;
  WaitScope waitScope(loop);

  uint tasksCompleted = 0;
  auto pafs = makeCompletionCountingPafs(5, tasksCompleted);
  auto& fulfillers = pafs.fulfillers;
  Promise<void> promise = joinPromises(kj::mv(pafs.promises));

  {
    uint i = 0;
    KJ_EXPECT(tasksCompleted == 0);

    // Joined tasks are not completed early.
    fulfillers[i++]->fulfill();
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == 0);

    fulfillers[i++]->fulfill();
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == 0);

    // Rejected tasks do not fail-fast.
    fulfillers[i++]->reject(KJ_EXCEPTION(FAILED, "Test exception"));
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == 0);

    fulfillers[i++]->fulfill();
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == 0);

    // The final fulfillment makes the promise ready.
    fulfillers[i++]->fulfill();
    KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("Test exception", promise.wait(waitScope));
    KJ_EXPECT(tasksCompleted == 4);
  }
}